

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void update_live(MIR_reg_t var,int out_p,bitmap_t live)

{
  long lVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int in_ECX;
  int extraout_EDX;
  size_t sVar6;
  undefined4 in_register_0000003c;
  bitmap_t pVVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int *piVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  
  pVVar7 = (bitmap_t)CONCAT44(in_register_0000003c,var);
  uVar10 = (ulong)var;
  if (out_p == 0) {
    sVar6 = uVar10 + 1;
    pVVar7 = live;
    bitmap_expand(live,sVar6);
    out_p = (int)sVar6;
    if (live == (bitmap_t)0x0) goto LAB_001726c3;
    live->varr[var >> 6] = live->varr[var >> 6] | 1L << (uVar10 & 0x3f);
  }
  else {
    if (live == (bitmap_t)0x0) {
      update_live_cold_1();
LAB_001726c3:
      update_live_cold_2();
      uVar10 = (ulong)(in_ECX != 0);
      sVar6 = pVVar7[0xf].els_num;
      lVar8 = 0x1e8;
      if (in_ECX == 0) {
        lVar8 = 0x188;
      }
      iVar2 = *(int *)(sVar6 + 0x180 + uVar10 * 4);
      uVar9 = (ulong)iVar2;
      bVar15 = 0 < (long)uVar9;
      if ((long)uVar9 < 1) {
        uVar13 = 0;
      }
      else {
        uVar11 = extraout_EDX - 8;
        piVar12 = (int *)(lVar8 + 8 + sVar6);
        uVar13 = 0;
        uVar14 = 1;
        do {
          if ((out_p != -1) && (piVar12[-1] == out_p)) break;
          if (uVar13 == 0) {
            iVar5 = 10;
            if (uVar11 < 3) {
              iVar5 = *(int *)(&DAT_001b3920 + (ulong)uVar11 * 4);
            }
            uVar4 = 1;
            if (*piVar12 != iVar5) goto LAB_00172767;
          }
          else {
LAB_00172767:
            iVar5 = 0xb;
            if (uVar11 < 3) {
              iVar5 = *(int *)(&DAT_001b392c + (ulong)uVar11 * 4);
            }
            uVar4 = uVar13;
            if (*piVar12 == iVar5) {
              uVar4 = 2;
            }
          }
          uVar13 = uVar4;
          bVar15 = uVar14 < uVar9;
          piVar12 = piVar12 + 3;
          lVar1 = (1 - uVar9) + uVar14;
          uVar14 = uVar14 + 1;
        } while (lVar1 != 1);
      }
      if (!bVar15) {
        if (1 < uVar13) {
          __assert_fail("rld_num <= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1e66,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
        }
        if (extraout_EDX == 10) {
          iVar5 = -1;
        }
        else {
          if ((extraout_EDX == 9) || (extraout_EDX == 8)) {
            iVar5 = 0x19;
          }
          else {
            iVar5 = 0xb;
          }
          iVar5 = iVar5 - (uint)(uVar13 == 0);
        }
        *(int *)(sVar6 + uVar10 * 4 + 0x180) = iVar2 + 1;
        if (7 < iVar2) {
          __assert_fail("rld_num < (2 * 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1e69,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
        }
        lVar8 = sVar6 + lVar8;
        *(int *)(lVar8 + 4 + uVar9 * 0xc) = out_p;
        *(int *)(lVar8 + uVar9 * 0xc) = extraout_EDX;
        *(int *)(lVar8 + 8 + uVar9 * 0xc) = iVar5;
      }
      return;
    }
    if (uVar10 < live->els_num << 6) {
      bVar3 = (byte)var & 0x3f;
      live->varr[var >> 6] =
           live->varr[var >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
    }
  }
  return;
}

Assistant:

static void update_live (MIR_reg_t var, int out_p, bitmap_t live) {
  if (out_p) {
    bitmap_clear_bit_p (live, var);
  } else {
    bitmap_set_bit_p (live, var);
  }
}